

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O3

int BuildHuffmanTable(HuffmanCode *root_table,int root_bits,int *code_lengths,int code_lengths_size,
                     uint16_t *sorted)

{
  ushort uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  HuffmanCode HVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  byte bVar11;
  byte bVar12;
  char cVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  HuffmanCode *pHVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int offset [16];
  int local_10c;
  int local_f8;
  long local_d0;
  int iStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  int aiStack_78 [18];
  
  bVar11 = (byte)root_bits;
  iVar6 = 1 << (bVar11 & 0x1f);
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_b8._0_4_ = 0;
  if (0 < code_lengths_size) {
    uVar22 = 0;
    do {
      if (0xf < (long)code_lengths[uVar22]) {
        return 0;
      }
      *(int *)(local_b8 + (long)code_lengths[uVar22] * 4) =
           *(int *)(local_b8 + (long)code_lengths[uVar22] * 4) + 1;
      uVar22 = uVar22 + 1;
    } while ((uint)code_lengths_size != uVar22);
  }
  if (local_b8._0_4_ == code_lengths_size) {
    return 0;
  }
  aiStack_78[1] = 0;
  lVar23 = 0;
  do {
    if (1 << ((char)lVar23 + 1U & 0x1f) < *(int *)(local_b8 + lVar23 * 4 + 4)) {
      return 0;
    }
    aiStack_78[lVar23 + 2] = *(int *)(local_b8 + lVar23 * 4 + 4) + aiStack_78[lVar23 + 1];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 0xe);
  if (0 < code_lengths_size) {
    uVar22 = 0;
    do {
      lVar23 = (long)code_lengths[uVar22];
      if (0 < lVar23) {
        if (sorted == (uint16_t *)0x0) {
          aiStack_78[lVar23] = aiStack_78[lVar23] + 1;
        }
        else {
          iVar31 = aiStack_78[lVar23];
          aiStack_78[lVar23] = iVar31 + 1;
          sorted[iVar31] = (uint16_t)uVar22;
        }
      }
      uVar22 = uVar22 + 1;
    } while ((uint)code_lengths_size != uVar22);
  }
  iVar31 = aiStack_78[0xf];
  auVar5 = _DAT_0012a030;
  auVar4 = _DAT_0012a020;
  auVar3 = _DAT_0012a010;
  if (aiStack_78[0xf] == 1) {
    if (sorted != (uint16_t *)0x0) {
      HVar7 = (HuffmanCode)((uint)*sorted << 0x10);
      lVar18 = (long)iVar6;
      lVar23 = 1;
      if (1 < lVar18) {
        lVar23 = lVar18;
      }
      lVar24 = lVar23 + -1;
      auVar34._8_4_ = (int)lVar24;
      auVar34._0_8_ = lVar24;
      auVar34._12_4_ = (int)((ulong)lVar24 >> 0x20);
      pHVar19 = root_table + lVar18 + -1;
      uVar22 = 0;
      auVar34 = auVar34 ^ _DAT_0012a030;
      do {
        auVar35._8_4_ = (int)uVar22;
        auVar35._0_8_ = uVar22;
        auVar35._12_4_ = (int)(uVar22 >> 0x20);
        auVar36 = (auVar35 | auVar4) ^ auVar5;
        iVar31 = auVar34._4_4_;
        if ((bool)(~(auVar36._4_4_ == iVar31 && auVar34._0_4_ < auVar36._0_4_ ||
                    iVar31 < auVar36._4_4_) & 1)) {
          *pHVar19 = HVar7;
        }
        if ((auVar36._12_4_ != auVar34._12_4_ || auVar36._8_4_ <= auVar34._8_4_) &&
            auVar36._12_4_ <= auVar34._12_4_) {
          pHVar19[-1] = HVar7;
        }
        auVar35 = (auVar35 | auVar3) ^ auVar5;
        iVar30 = auVar35._4_4_;
        if (iVar30 <= iVar31 && (iVar30 != iVar31 || auVar35._0_4_ <= auVar34._0_4_)) {
          pHVar19[-2] = HVar7;
          pHVar19[-3] = HVar7;
        }
        uVar22 = uVar22 + 4;
        pHVar19 = pHVar19 + -4;
      } while (((int)lVar23 + 3U & 0xfffffffc) != uVar22);
      return iVar6;
    }
    return iVar6;
  }
  local_10c = 1;
  if (root_bits < 1) {
    lVar23 = 0;
    iVar30 = 1;
    uVar22 = 0;
  }
  else {
    iVar25 = 2;
    uVar28 = 1;
    lVar23 = 0;
    iVar30 = 1;
    uVar22 = 0;
    iVar8 = 1;
    do {
      iVar10 = *(int *)(local_b8 + uVar28 * 4);
      local_10c = iVar8 * 2 - iVar10;
      if (local_10c < 0) {
        return 0;
      }
      if (0 < iVar10 && root_table != (HuffmanCode *)0x0) {
        lVar23 = (long)(int)lVar23;
        do {
          uVar1 = sorted[lVar23];
          iVar21 = iVar6;
          do {
            iVar29 = iVar21 - iVar25;
            iVar21 = iVar21 - iVar25;
            root_table[uVar22 + (long)iVar29] =
                 (HuffmanCode)((uint)uVar1 << 0x10 | (uint)uVar28 & 0xff);
            uVar27 = 1 << ((char)uVar28 - 1U & 0x1f);
          } while (0 < iVar21);
          do {
            uVar9 = uVar27;
            uVar27 = uVar9 >> 1;
          } while ((uVar9 & (uint)uVar22) != 0);
          lVar23 = lVar23 + 1;
          uVar22 = (ulong)(((uint)uVar22 & uVar9 - 1) + uVar9);
          bVar2 = 1 < iVar10;
          iVar10 = iVar10 + -1;
        } while (bVar2);
        *(undefined4 *)(local_b8 + uVar28 * 4) = 0;
      }
      iVar30 = iVar30 + iVar8 * 2;
      uVar28 = uVar28 + 1;
      iVar25 = iVar25 * 2;
      iVar8 = local_10c;
    } while (uVar28 != root_bits + 1);
    if (0xe < root_bits) goto LAB_0011c59e;
  }
  uVar9 = iVar6 - 1;
  local_f8 = root_bits + 1;
  local_d0 = (long)root_bits + 2;
  uVar27 = 0xffffffff;
  iVar25 = 2;
  lVar18 = (long)root_bits;
  pHVar19 = root_table;
  iVar8 = iVar6;
  do {
    iVar10 = local_10c * 2 - *(int *)(local_b8 + lVar18 * 4 + 4);
    if (iVar10 < 0) {
      return 0;
    }
    lVar24 = lVar18 + 1;
    if ((root_table != (HuffmanCode *)0x0) && (0 < *(int *)(local_b8 + lVar18 * 4 + 4))) {
      uVar15 = (int)lVar24 - root_bits;
      bVar12 = (byte)uVar15;
      iVar31 = 1 << (bVar12 & 0x1f);
      lVar23 = (long)(int)lVar23;
      do {
        uVar20 = (uint)uVar22;
        uVar26 = uVar20 & uVar9;
        if (uVar26 != uVar27) {
          lVar33 = local_d0;
          iVar21 = iVar31;
          iVar29 = local_f8;
          bVar14 = bVar12;
          if (lVar18 != 0xe) {
            do {
              cVar13 = (char)iVar29;
              iVar16 = iVar21 - (&iStack_bc)[lVar33];
              if (iVar16 == 0 || iVar21 < (&iStack_bc)[lVar33]) goto LAB_0011c4c3;
              iVar32 = (int)lVar33;
              lVar33 = lVar33 + 1;
              iVar29 = iVar29 + 1;
              iVar21 = iVar16 * 2;
            } while (iVar32 != 0xf);
            cVar13 = '\x0f';
LAB_0011c4c3:
            bVar14 = cVar13 - bVar11;
            iVar21 = 1 << (bVar14 & 0x1f);
          }
          pHVar19 = pHVar19 + iVar8;
          iVar6 = iVar6 + iVar21;
          root_table[uVar26].bits = bVar14 + bVar11;
          root_table[uVar26].value =
               (short)((uint)((int)pHVar19 - (int)root_table) >> 2) - (short)uVar26;
          uVar27 = uVar26;
          iVar8 = iVar21;
        }
        uVar1 = sorted[lVar23];
        iVar21 = iVar8;
        do {
          iVar29 = iVar21 - iVar25;
          iVar21 = iVar21 - iVar25;
          pHVar19[(ulong)(uVar20 >> (bVar11 & 0x1f)) + (long)iVar29] =
               (HuffmanCode)((uint)uVar1 * 0x10000 + (uVar15 & 0xff));
          uVar26 = 1 << ((byte)lVar18 & 0x1f);
        } while (0 < iVar21);
        do {
          uVar17 = uVar26;
          uVar26 = uVar17 >> 1;
        } while ((uVar17 & uVar20) != 0);
        lVar23 = lVar23 + 1;
        uVar22 = (ulong)((uVar20 & uVar17 - 1) + uVar17);
        iVar21 = *(int *)(local_b8 + lVar24 * 4);
        *(int *)(local_b8 + lVar24 * 4) = iVar21 + -1;
      } while (1 < iVar21);
    }
    iVar30 = iVar30 + local_10c * 2;
    iVar25 = iVar25 * 2;
    local_f8 = local_f8 + 1;
    local_d0 = local_d0 + 1;
    lVar18 = lVar24;
    iVar31 = aiStack_78[0xf];
    local_10c = iVar10;
  } while (lVar24 != 0xf);
LAB_0011c59e:
  iVar25 = 0;
  if (iVar30 == iVar31 * 2 + -1) {
    iVar25 = iVar6;
  }
  return iVar25;
}

Assistant:

static int BuildHuffmanTable(HuffmanCode* const root_table, int root_bits,
                             const int code_lengths[], int code_lengths_size,
                             uint16_t sorted[]) {
  HuffmanCode* table = root_table;  // next available space in table
  int total_size = 1 << root_bits;  // total size root table + 2nd level table
  int len;                          // current code length
  int symbol;                       // symbol index in original or sorted table
  // number of codes of each length:
  int count[MAX_ALLOWED_CODE_LENGTH + 1] = { 0 };
  // offsets in sorted table for each length:
  int offset[MAX_ALLOWED_CODE_LENGTH + 1];

  assert(code_lengths_size != 0);
  assert(code_lengths != NULL);
  assert((root_table != NULL && sorted != NULL) ||
         (root_table == NULL && sorted == NULL));
  assert(root_bits > 0);

  // Build histogram of code lengths.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    if (code_lengths[symbol] > MAX_ALLOWED_CODE_LENGTH) {
      return 0;
    }
    ++count[code_lengths[symbol]];
  }

  // Error, all code lengths are zeros.
  if (count[0] == code_lengths_size) {
    return 0;
  }

  // Generate offsets into sorted symbol table by code length.
  offset[1] = 0;
  for (len = 1; len < MAX_ALLOWED_CODE_LENGTH; ++len) {
    if (count[len] > (1 << len)) {
      return 0;
    }
    offset[len + 1] = offset[len] + count[len];
  }

  // Sort symbols by length, by symbol order within each length.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    const int symbol_code_length = code_lengths[symbol];
    if (code_lengths[symbol] > 0) {
      if (sorted != NULL) {
        sorted[offset[symbol_code_length]++] = symbol;
      } else {
        offset[symbol_code_length]++;
      }
    }
  }

  // Special case code with only one value.
  if (offset[MAX_ALLOWED_CODE_LENGTH] == 1) {
    if (sorted != NULL) {
      HuffmanCode code;
      code.bits = 0;
      code.value = (uint16_t)sorted[0];
      ReplicateValue(table, 1, total_size, code);
    }
    return total_size;
  }

  {
    int step;              // step size to replicate values in current table
    uint32_t low = -1;     // low bits for current root entry
    uint32_t mask = total_size - 1;    // mask for low bits
    uint32_t key = 0;      // reversed prefix code
    int num_nodes = 1;     // number of Huffman tree nodes
    int num_open = 1;      // number of open branches in current tree level
    int table_bits = root_bits;        // key length of current table
    int table_size = 1 << table_bits;  // size of current table
    symbol = 0;
    // Fill in root table.
    for (len = 1, step = 2; len <= root_bits; ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      if (root_table == NULL) continue;
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        code.bits = (uint8_t)len;
        code.value = (uint16_t)sorted[symbol++];
        ReplicateValue(&table[key], step, table_size, code);
        key = GetNextKey(key, len);
      }
    }

    // Fill in 2nd level tables and add pointers to root table.
    for (len = root_bits + 1, step = 2; len <= MAX_ALLOWED_CODE_LENGTH;
         ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      if (root_table == NULL) continue;
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        if ((key & mask) != low) {
          table += table_size;
          table_bits = NextTableBitSize(count, len, root_bits);
          table_size = 1 << table_bits;
          total_size += table_size;
          low = key & mask;
          root_table[low].bits = (uint8_t)(table_bits + root_bits);
          root_table[low].value = (uint16_t)((table - root_table) - low);
        }
        code.bits = (uint8_t)(len - root_bits);
        code.value = (uint16_t)sorted[symbol++];
        ReplicateValue(&table[key >> root_bits], step, table_size, code);
        key = GetNextKey(key, len);
      }
    }

    // Check if tree is full.
    if (num_nodes != 2 * offset[MAX_ALLOWED_CODE_LENGTH] - 1) {
      return 0;
    }
  }

  return total_size;
}